

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

void google::protobuf::internal::anon_unknown_105::EnsureArenaStringIsNotDefault
               (MessageLite *msg,ArenaStringPtr *field)

{
  Arena *arena;
  
  if (((ulong)(field->tagged_ptr_).ptr_ & 3) != 0) {
    return;
  }
  arena = (Arena *)(msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set(field,(string_view)(ZEXT816(0x1141ae9) << 0x40),arena);
  return;
}

Assistant:

inline bool IsDefault() const { return (as_int() & kMask) == kDefault; }